

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apple_sysf.cpp
# Opt level: O0

void __thiscall apple_sysf_t::sysf_store_body_t::_read(sysf_store_body_t *this)

{
  __type _Var1;
  bool bVar2;
  vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>
  *this_00;
  sysf_variable_t *this_01;
  pointer this_02;
  uint64_t uVar3;
  kstream *this_03;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_04;
  pointer this_05;
  bool local_d1;
  uint8_t local_9d;
  int local_9c;
  int i_1;
  byte local_8b;
  byte local_8a;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  byte local_61;
  string local_60;
  unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>
  local_40 [3];
  pointer local_28;
  sysf_variable_t *_;
  int i;
  sysf_store_body_t *local_10;
  sysf_store_body_t *this_local;
  
  local_10 = this;
  this_00 = (vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>
             *)operator_new(0x18);
  memset(this_00,0,0x18);
  std::
  vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>
  ::vector(this_00);
  std::
  unique_ptr<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>,std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>>>,std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>,std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>>>>>
  ::
  unique_ptr<std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>,std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>>>>,void>
            ((unique_ptr<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>,std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>>>,std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>,std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>>>>>
              *)&stack0xffffffffffffffe8,this_00);
  std::
  unique_ptr<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_>_>
  ::operator=(&this->m_variables,
              (unique_ptr<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_>_>
               *)&stack0xffffffffffffffe8);
  std::
  unique_ptr<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_>_>
                 *)&stack0xffffffffffffffe8);
  _._4_4_ = 0;
  do {
    this_01 = (sysf_variable_t *)operator_new(0x80);
    sysf_variable_t::sysf_variable_t(this_01,(this->super_kstruct).m__io,this,this->m__root);
    local_28 = this_01;
    this_02 = std::
              unique_ptr<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_>_>
              ::operator->(&this->m_variables);
    std::
    unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>::
    unique_ptr<std::default_delete<apple_sysf_t::sysf_variable_t>,void>
              ((unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>
                *)local_40,local_28);
    std::
    vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>
    ::push_back(this_02,(value_type *)local_40);
    std::
    unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>::
    ~unique_ptr(local_40);
    _._4_4_ = _._4_4_ + 1;
    uVar3 = sysf_variable_t::len_name(local_28);
    local_61 = 0;
    local_8a = 0;
    local_8b = 0;
    if (uVar3 == 3) {
      sysf_variable_t::name_abi_cxx11_(&local_60,local_28);
      local_61 = 1;
      std::allocator<char>::allocator();
      local_8a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"EOF",&local_89);
      local_8b = 1;
      _Var1 = std::operator==(&local_60,&local_88);
      local_d1 = true;
      if (!_Var1) goto LAB_001f02ec;
    }
    else {
LAB_001f02ec:
      this_03 = kaitai::kstruct::_io(&this->super_kstruct);
      local_d1 = kaitai::kstream::is_eof(this_03);
    }
    if ((local_8b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_88);
    }
    if ((local_8a & 1) != 0) {
      std::allocator<char>::~allocator(&local_89);
    }
    if ((local_61 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_60);
    }
    if (((local_d1 ^ 0xffU) & 1) == 0) {
      this_04 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)operator_new(0x18);
      memset(this_04,0,0x18);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(this_04);
      std::
      unique_ptr<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::default_delete<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::
      unique_ptr<std::default_delete<std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((unique_ptr<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::default_delete<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  *)&stack0xffffffffffffff68,this_04);
      std::
      unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator=(&this->m_zeroes,
                  (unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)&stack0xffffffffffffff68);
      std::
      unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~unique_ptr((unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)&stack0xffffffffffffff68);
      local_9c = 0;
      while (bVar2 = kaitai::kstream::is_eof((this->super_kstruct).m__io),
            ((bVar2 ^ 0xffU) & 1) != 0) {
        this_05 = std::
                  unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator->(&this->m_zeroes);
        local_9d = kaitai::kstream::read_u1((this->super_kstruct).m__io);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(this_05,&local_9d);
        local_9c = local_9c + 1;
      }
      return;
    }
  } while( true );
}

Assistant:

void apple_sysf_t::sysf_store_body_t::_read() {
    m_variables = std::unique_ptr<std::vector<std::unique_ptr<sysf_variable_t>>>(new std::vector<std::unique_ptr<sysf_variable_t>>());
    {
        int i = 0;
        sysf_variable_t* _;
        do {
            _ = new sysf_variable_t(m__io, this, m__root);
            m_variables->push_back(std::move(std::unique_ptr<sysf_variable_t>(_)));
            i++;
        } while (!( (( ((_->len_name() == 3) && (_->name() == (std::string("EOF")))) ) || (_io()->is_eof())) ));
    }
    m_zeroes = std::unique_ptr<std::vector<uint8_t>>(new std::vector<uint8_t>());
    {
        int i = 0;
        while (!m__io->is_eof()) {
            m_zeroes->push_back(std::move(m__io->read_u1()));
            i++;
        }
    }
}